

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::QualifiedIdentifier::addToPath
          (QualifiedIdentifier *this,IdentifierPath *path,
          pool_ptr<soul::AST::Expression> *specialisationArgs)

{
  value_type local_80;
  pool_ptr<soul::AST::Expression> *local_20;
  pool_ptr<soul::AST::Expression> *specialisationArgs_local;
  IdentifierPath *path_local;
  QualifiedIdentifier *this_local;
  
  local_20 = specialisationArgs;
  specialisationArgs_local = (pool_ptr<soul::AST::Expression> *)path;
  path_local = (IdentifierPath *)this;
  IdentifierPath::IdentifierPath(&local_80.path,path);
  local_80.specialisationArgs = (pool_ptr<soul::AST::Expression>)specialisationArgs->object;
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::push_back(&this->pathSections,&local_80);
  PathSection::~PathSection(&local_80);
  return;
}

Assistant:

void addToPath (IdentifierPath path, pool_ptr<Expression> specialisationArgs)
        {
            pathSections.push_back ({ path, specialisationArgs });
        }